

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

void tokthini(errcxdef *errctx,mcmcxdef *memctx,toktdef *toktab1)

{
  uchar *puVar1;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int i;
  tokthdef *toktab;
  mcmcxdef *in_stack_00000028;
  int local_24;
  
  memset(in_RDX,0,0xb50);
  *in_RDX = tokthadd;
  in_RDX[1] = tokthsea;
  in_RDX[2] = tokthset;
  in_RDX[3] = toktheach;
  in_RDX[5] = in_RDI;
  in_RDX[6] = in_RSI;
  puVar1 = mcmalo0(in_stack_00000028,errctx._6_2_,(mcmon *)memctx,toktab1._6_2_,(int)toktab1);
  in_RDX[0x168] = puVar1;
  *(undefined4 *)(in_RDX + 0x107) = 0;
  *(undefined2 *)(in_RDX + 0x169) = 0x1000;
  for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
    *(undefined2 *)(in_RDX + (long)local_24 + 7) = 0xffff;
  }
  return;
}

Assistant:

void tokthini(errcxdef *errctx, mcmcxdef *memctx, toktdef *toktab1)
{
    tokthdef *toktab = (tokthdef *)toktab1;      /* convert to correct type */
    int       i;

    CLRSTRUCT(*toktab);
    toktab->tokthsc.toktfadd = tokthadd;           /* set add-symbol method */
    toktab->tokthsc.toktfsea = tokthsea;         /* set search-table method */
    toktab->tokthsc.toktfset = tokthset;                   /* update symbol */
    toktab->tokthsc.toktfeach = toktheach;       /* call fn for all symbols */
    toktab->tokthsc.tokterr = errctx;         /* set error handling context */
    toktab->tokthmem = memctx;                    /* memory manager context */
    toktab->tokthcpool = mcmalo(memctx, (ushort)TOKTHSIZE,
                                &toktab->tokthpool[0]);
    toktab->tokthpcnt = 0;
    toktab->tokthsize = TOKTHSIZE;

    /* set hash table entries to point to nothing (MCMONINV) */
    for (i = 0 ; i < TOKHASHSIZE ; ++i)
        toktab->tokthhsh[i].tokthpobj = MCMONINV;
}